

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::
basic_json_reader<wchar_t,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>,std::allocator<char>>
::
basic_json_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
          (basic_json_reader<wchar_t,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<char>_>
           *this,iterator_source<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *source,basic_json_visitor<wchar_t> *visitor,
          basic_json_decode_options<wchar_t> *options,allocator<char> *temp_alloc)

{
  basic_json_decode_options<wchar_t> *in_RCX;
  iterator_source<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_RDX;
  basic_json_reader<wchar_t,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<char>_>
  *in_RSI;
  basic_json_decode_options<wchar_t> *in_R8;
  allocator<char> *in_stack_ffffffffffffffc8;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_stack_ffffffffffffffd0;
  iterator_source<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *source_00;
  basic_json_reader<wchar_t,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<char>_>
  *this_00;
  
  source_00 = in_RDX;
  this_00 = in_RSI;
  basic_json_decode_options<wchar_t>::err_handler(in_RCX);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)in_RDX,
             (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)in_RSI);
  basic_json_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
            (this_00,source_00,(basic_json_visitor<wchar_t> *)in_RCX,in_R8,in_stack_ffffffffffffffd0
             ,in_stack_ffffffffffffffc8);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)0x9e89f4);
  return;
}

Assistant:

basic_json_reader(Sourceable&& source, 
                          basic_json_visitor<CharT>& visitor,
                          const basic_json_decode_options<CharT>& options, 
                          const TempAllocator& temp_alloc = TempAllocator())
            : basic_json_reader(std::forward<Sourceable>(source),
                                visitor,
                                options,
                                options.err_handler(),
                                temp_alloc)
        {
        }